

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void line_attempt_2(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  float fVar1;
  int y;
  float t;
  int x;
  TGAImage *image_local;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  TGAColor color_local;
  
  register0x00000000 = color.bgra;
  x0_local._3_1_ = color.bytespp;
  for (y = x0; y <= x1; y = y + 1) {
    fVar1 = (float)(y - x0) / (float)(x1 - x0);
    TGAImage::set(image,(long)y,(long)(int)((float)y0 * (1.0 - fVar1) + (float)y1 * fVar1),
                  (TGAColor *)((long)&y0_local + 3));
  }
  return;
}

Assistant:

void line_attempt_2(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    for (int x = x0; x <= x1; x++) {
        float t = static_cast<float>(x - x0) / static_cast<float>(x1 - x0);
        int y = static_cast<int>(y0 * (1. - t) + static_cast<float>(y1) * t);
        image.set(x, y, color);
    }
}